

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O3

string * LicenseInfo_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string *in_RDI;
  undefined8 uVar6;
  char (*in_R8) [27];
  char (*pacVar7) [38];
  long in_FS_OFFSET;
  string URL_SOURCE_CODE;
  int local_3a8;
  undefined1 local_3a4 [12];
  long *local_398 [2];
  long local_388 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  long *local_338 [2];
  long local_328 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  long *local_2f8 [2];
  long local_2e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  long *local_298 [2];
  long local_288 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  long *local_238 [2];
  long local_228 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"<https://github.com/bitcoin/bitcoin>","");
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Copyright (C) %i-%i","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Copyright (C) %i-%i","");
  }
  else {
    local_298[0] = (long *)0x27d6b6;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_218,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_298);
  }
  local_3a4._0_4_ = 0x7d9;
  local_3a8 = 0x7e8;
  tinyformat::format<int,int>
            (&local_1f8,(tinyformat *)&local_218,(string *)local_3a4,&local_3a8,(int *)in_R8);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1f8," ");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (paVar5 == paVar4) {
    local_1d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_1d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_1d8._M_dataplus._M_p = (pointer)paVar5;
  }
  local_1d8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  CopyrightHolders(&local_1b8,&local_1d8);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1b8,"\n");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (paVar5 == paVar4) {
    local_198.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_198._M_dataplus._M_p = (pointer)paVar5;
  }
  local_198._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_198,"\n");
  local_178._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == paVar5) {
    local_178.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_178.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_178.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  else {
    local_178.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_178._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "Please contribute if you find %s useful. Visit %s for further information about the software."
             ,"");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,
               "Please contribute if you find %s useful. Visit %s for further information about the software."
               ,"");
  }
  else {
    local_2f8[0] = (long *)0x27d6ca;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_278,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_2f8);
  }
  tinyformat::format<char[13],char[27]>
            (&local_258,(tinyformat *)&local_278,(string *)"Bitcoin Core",
             (char (*) [13])"<https://bitcoincore.org/>",in_R8);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    uVar6 = local_178.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_258._M_string_length + local_178._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      uVar6 = local_258.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_258._M_string_length + local_178._M_string_length) goto LAB_001df958;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_258,0,0,local_178._M_dataplus._M_p,local_178._M_string_length);
  }
  else {
LAB_001df958:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_178,local_258._M_dataplus._M_p,local_258._M_string_length);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_158.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_158.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_158._M_dataplus._M_p = (pointer)paVar4;
  }
  local_158._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_158,"\n");
  local_138._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar3->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_138._M_dataplus._M_p == args) {
    local_138.field_2._M_allocated_capacity = *(undefined8 *)args;
    local_138.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_138.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *(undefined8 *)args;
  }
  local_138._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)args;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f8,"The source code is available from %s.","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,"The source code is available from %s.","");
  }
  else {
    local_338[0] = (long *)0x27d743;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_2d8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_338);
  }
  tinyformat::format<std::__cxx11::string>(&local_2b8,(tinyformat *)&local_2d8,&local_58,args);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    uVar6 = local_138.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_2b8._M_string_length + local_138._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      uVar6 = local_2b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_2b8._M_string_length + local_138._M_string_length) goto LAB_001dfb18;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_2b8,0,0,local_138._M_dataplus._M_p,local_138._M_string_length);
  }
  else {
LAB_001dfb18:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_138,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  }
  local_118._M_allocated_capacity = (size_type)&local_108;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_108._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_108._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_108._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_118._M_allocated_capacity = (size_type)paVar4;
  }
  local_118._8_8_ = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_118,"\n");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (paVar5 == paVar4) {
    local_f8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar5;
  }
  local_f8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f8,"\n");
  local_d8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == paVar5) {
    local_d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_d8.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_d8.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_d8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"This is experimental software.","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_318,"This is experimental software.","");
  }
  else {
    local_398[0] = (long *)0x27d769;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_318,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_398);
  }
  uVar6 = (char *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    uVar6 = local_d8.field_2._M_allocated_capacity;
  }
  pacVar7 = (char (*) [38])local_d8._M_string_length;
  if ((ulong)uVar6 < (char *)local_d8._M_string_length + local_318._M_string_length) {
    uVar6 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      uVar6 = local_318.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < (char *)local_d8._M_string_length + local_318._M_string_length)
    goto LAB_001dfd1e;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_318,0,0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  }
  else {
LAB_001dfd1e:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_d8,local_318._M_dataplus._M_p,local_318._M_string_length);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_b8._M_dataplus._M_p = (pointer)paVar4;
  }
  local_b8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8,"\n");
  paVar5 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar4) {
    local_98.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_98.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_98.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_98._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_98._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_398,
             "Distributed under the MIT software license, see the accompanying file %s or %s","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_378,
               "Distributed under the MIT software license, see the accompanying file %s or %s","");
  }
  else {
    local_3a4._4_8_ =
         "Distributed under the MIT software license, see the accompanying file %s or %s";
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_378,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)(local_3a4 + 4));
  }
  tinyformat::format<char[8],char[38]>
            (&local_358,(tinyformat *)&local_378,(string *)"COPYING",
             (char (*) [8])"<https://opensource.org/licenses/MIT>",pacVar7);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar5) {
    uVar6 = local_98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_358._M_string_length + local_98._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      uVar6 = local_358.field_2._M_allocated_capacity;
    }
    if (local_358._M_string_length + local_98._M_string_length <= (ulong)uVar6) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_358,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
      goto LAB_001dfee2;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_98,local_358._M_dataplus._M_p,local_358._M_string_length);
LAB_001dfee2:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (paVar1 == paVar4) {
    local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_78._M_dataplus._M_p = (pointer)paVar1;
  }
  local_78._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_78,"\n");
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar2 = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar6 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar6;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar2;
    (in_RDI->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar5) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,(ulong)(local_318.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_allocated_capacity != &local_108) {
    operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string LicenseInfo()
{
    const std::string URL_SOURCE_CODE = "<https://github.com/bitcoin/bitcoin>";

    return CopyrightHolders(strprintf(_("Copyright (C) %i-%i").translated, 2009, COPYRIGHT_YEAR) + " ") + "\n" +
           "\n" +
           strprintf(_("Please contribute if you find %s useful. "
                       "Visit %s for further information about the software.").translated, PACKAGE_NAME, "<" PACKAGE_URL ">") +
           "\n" +
           strprintf(_("The source code is available from %s.").translated, URL_SOURCE_CODE) +
           "\n" +
           "\n" +
           _("This is experimental software.").translated + "\n" +
           strprintf(_("Distributed under the MIT software license, see the accompanying file %s or %s").translated, "COPYING", "<https://opensource.org/licenses/MIT>") +
           "\n";
}